

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxvfmt.cpp
# Opt level: O1

uint32 rw::xbox::getVertexFmtStride(uint32 fmt)

{
  uint32 uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint32 uVar5;
  
  uVar2 = fmt >> 4 & 0xf;
  iVar4 = 4;
  iVar3 = 4;
  if ((fmt & 0xf) != 4) {
    iVar3 = *(int *)(vertexFormatSizes + (ulong)(fmt & 0xf) * 4) * 3;
  }
  if (uVar2 != 4) {
    iVar4 = *(int *)(vertexFormatSizes + (ulong)uVar2 * 4) * 3;
  }
  uVar5 = (fmt >> 0x16 & 4) + iVar3 + iVar4;
  iVar3 = 8;
  do {
    uVar2 = fmt >> ((byte)iVar3 & 0x1f) & 0xf;
    iVar4 = 4;
    if (uVar2 != 4) {
      iVar4 = *(int *)(vertexFormatSizes + (ulong)uVar2 * 4) * 2;
    }
    uVar5 = uVar5 + iVar4;
    iVar3 = iVar3 + 4;
  } while (iVar3 != 0x18);
  uVar1 = uVar5 + 8;
  if ((fmt & 0xe000000) == 0) {
    uVar1 = uVar5;
  }
  return uVar1;
}

Assistant:

uint32
getVertexFmtStride(uint32 fmt)
{
	uint32 stride = 0;
	uint32 v = fmt & 0xF;
	uint32 n = (fmt >> 4) & 0xF;
	stride += v == 4 ? 4 : 3*vertexFormatSizes[v];
	stride += n == 4 ? 4 : 3*vertexFormatSizes[n];
	if(fmt & 0x1000000)
		stride += 4;
	for(int i = 0; i < 4; i++){
		uint32 t = (fmt >> (i*4 + 8)) & 0xF;
		stride += t == 4 ? 4 : 2*vertexFormatSizes[t];
	}
	if(fmt & 0xE000000)
		stride += 8;
	return stride;
}